

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_symbolLocalBinding_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t name,
          sysbvm_tuple_t type,sysbvm_tuple_t ownerFunction,size_t vectorIndex)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).symbolLocalBindingType,7);
  (psVar1->field_1).pointers[0] = name;
  psVar1[1].field_1.pointers[0] = sourcePosition;
  psVar1[2].header.field_0.typePointer = type;
  psVar1[2].header.identityHashAndFlags = (int)ownerFunction;
  psVar1[2].header.objectSize = (int)(ownerFunction >> 0x20);
  if (vectorIndex + 0x800000000000000 >> 0x3c == 0) {
    sVar2 = vectorIndex << 4 | 0xb;
  }
  else {
    sVar2 = sysbvm_tuple_uint64_encodeBig(context,vectorIndex);
  }
  psVar1[2].field_1.pointers[0] = sVar2;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbolLocalBinding_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t name, sysbvm_tuple_t type, sysbvm_tuple_t ownerFunction, size_t vectorIndex)
{
    sysbvm_symbolLocalBinding_t *result = (sysbvm_symbolLocalBinding_t*)sysbvm_context_allocatePointerTuple(context, context->roots.symbolLocalBindingType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_symbolLocalBinding_t));
    result->super.super.super.name = name;
    result->super.super.sourcePosition = sourcePosition;
    result->super.super.type = type;
    result->super.ownerFunction = ownerFunction;
    result->super.vectorIndex = sysbvm_tuple_size_encode(context, vectorIndex);
    return (sysbvm_tuple_t)result;
}